

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O0

void __thiscall agg::gsv_text::text(gsv_text *this,char *text)

{
  uint size;
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  uint new_size;
  char *text_local;
  gsv_text *this_local;
  
  if (text == (char *)0x0) {
    this->m_chr[0] = '\0';
    this->m_text = this->m_chr;
  }
  else {
    sVar2 = strlen(text);
    size = (int)sVar2 + 1;
    uVar1 = pod_array<char>::size(&this->m_text_buf);
    if (uVar1 < size) {
      pod_array<char>::resize(&this->m_text_buf,size);
    }
    pcVar3 = pod_array<char>::operator[](&this->m_text_buf,0);
    memcpy(pcVar3,text,(ulong)size);
    pcVar3 = pod_array<char>::operator[](&this->m_text_buf,0);
    this->m_text = pcVar3;
  }
  return;
}

Assistant:

void gsv_text::text(const char* text)
    {
        if(text == 0)
        {
            m_chr[0] = 0;
            m_text = m_chr;
            return;
        }
        unsigned new_size = strlen(text) + 1;
        if(new_size > m_text_buf.size())
        {
            m_text_buf.resize(new_size);
        }
        memcpy(&m_text_buf[0], text, new_size);
        m_text = &m_text_buf[0];
    }